

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_objref.cpp
# Opt level: O3

void __thiscall ON_ObjRef::Destroy(ON_ObjRef *this)

{
  double dVar1;
  
  DecrementProxyReferenceCount(this);
  (this->m_uuid).Data1 = 0;
  (this->m_uuid).Data2 = 0;
  (this->m_uuid).Data3 = 0;
  (this->m_uuid).Data4[0] = '\0';
  (this->m_uuid).Data4[1] = '\0';
  (this->m_uuid).Data4[2] = '\0';
  (this->m_uuid).Data4[3] = '\0';
  (this->m_uuid).Data4[4] = '\0';
  (this->m_uuid).Data4[5] = '\0';
  (this->m_uuid).Data4[6] = '\0';
  (this->m_uuid).Data4[7] = '\0';
  this->m_geometry_type = 0;
  this->m_runtime_sn = 0;
  this->m_geometry = (ON_Geometry *)0x0;
  this->m_parent_geometry = (ON_Geometry *)0x0;
  dVar1 = ON_3dPoint::UnsetPoint.y;
  (this->m_point).x = ON_3dPoint::UnsetPoint.x;
  (this->m_point).y = dVar1;
  (this->m_point).z = ON_3dPoint::UnsetPoint.z;
  this->m_osnap_mode = os_none;
  this->m__proxy1 = (ON_Object *)0x0;
  this->m__proxy2 = (ON_Object *)0x0;
  this->m__proxy_ref_count = (int *)0x0;
  return;
}

Assistant:

void ON_ObjRef::Destroy()
{
  DecrementProxyReferenceCount();
  m_uuid = ON_nil_uuid;
  m_geometry = 0;
  m_parent_geometry = 0;
  m_geometry_type = ON::unknown_object_type;
  m_runtime_sn = 0;
  m_point = ON_3dPoint::UnsetPoint;
  m_osnap_mode = ON::os_none;
  m__proxy1 = 0;
  m__proxy2 = 0;
  m__proxy_ref_count = 0;
}